

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sa_sampler.hpp
# Opt level: O3

void __thiscall
openjij::sampler::SASampler<openjij::graph::BinaryPolynomialModel<double>_>::Sample
          (SASampler<openjij::graph::BinaryPolynomialModel<double>_> *this)

{
  uint uVar1;
  random_device rStack_1398;
  
  std::random_device::random_device(&rStack_1398);
  uVar1 = std::random_device::_M_getval();
  Sample(this,(ulong)uVar1);
  std::random_device::_M_fini();
  return;
}

Assistant:

void Sample() {
      Sample(std::random_device()());
   }